

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decrypt.c
# Opt level: O0

int decrypt(EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  uint16_t uVar1;
  gf gVar2;
  gf t;
  gf images [3488];
  gf locator [65];
  gf s_cmp [128];
  gf s [128];
  gf g [65];
  uchar r [436];
  uint16_t check;
  int w;
  int i;
  undefined6 in_stack_ffffffffffffdfb0;
  undefined2 in_stack_ffffffffffffdfb6;
  gf *in_stack_ffffffffffffdfb8;
  gf *in_stack_ffffffffffffdfc0;
  uchar *in_stack_ffffffffffffdfc8;
  gf *in_stack_ffffffffffffdfd0;
  gf *in_stack_ffffffffffffdfd8;
  gf *in_stack_ffffffffffffdfe0;
  gf *in_stack_ffffffffffffe168;
  gf *in_stack_ffffffffffffe170;
  ushort local_478 [128];
  ushort local_378 [128];
  uint16_t local_278 [64];
  undefined2 local_1f8;
  undefined1 local_1e8 [96];
  undefined1 auStack_188 [350];
  ushort local_2a;
  int local_28;
  int local_24;
  uchar *local_20;
  size_t *local_18;
  uchar *local_10;
  EVP_PKEY_CTX *local_8;
  
  local_28 = 0;
  for (local_24 = 0; local_24 < 0x60; local_24 = local_24 + 1) {
    local_1e8[local_24] = *(undefined1 *)((long)outlen + (long)local_24);
  }
  for (local_24 = 0x60; local_24 < 0x1b4; local_24 = local_24 + 1) {
    local_1e8[local_24] = 0;
  }
  local_20 = in;
  local_18 = outlen;
  local_10 = out;
  local_8 = ctx;
  for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
    uVar1 = load2(local_10);
    local_278[local_24] = uVar1;
    local_278[local_24] = local_278[local_24] & 0xfff;
    local_10 = local_10 + 2;
  }
  local_1f8 = 1;
  synd(in_stack_ffffffffffffdfe0,in_stack_ffffffffffffdfd8,in_stack_ffffffffffffdfd0,
       in_stack_ffffffffffffdfc8);
  bm(in_stack_ffffffffffffe170,in_stack_ffffffffffffe168);
  root(in_stack_ffffffffffffdfc0,in_stack_ffffffffffffdfb8,
       (gf *)CONCAT26(in_stack_ffffffffffffdfb6,in_stack_ffffffffffffdfb0));
  for (local_24 = 0; local_24 < 0x1b4; local_24 = local_24 + 1) {
    local_8[local_24] = (EVP_PKEY_CTX)0x0;
  }
  for (local_24 = 0; local_24 < 0xda0; local_24 = local_24 + 1) {
    gVar2 = gf_iszero(*(gf *)(&stack0xffffffffffffdfb8 + (long)local_24 * 2));
    local_8[local_24 / 8] =
         (EVP_PKEY_CTX)
         ((byte)local_8[local_24 / 8] | (char)(gVar2 & 1) << ((byte)((long)local_24 % 8) & 0x1f));
    local_28 = (uint)(gVar2 & 1) + local_28;
  }
  synd(in_stack_ffffffffffffdfe0,in_stack_ffffffffffffdfd8,in_stack_ffffffffffffdfd0,
       in_stack_ffffffffffffdfc8);
  local_2a = (ushort)local_28 ^ 0x40;
  for (local_24 = 0; local_24 < 0x80; local_24 = local_24 + 1) {
    local_2a = local_2a | local_378[local_24] ^ local_478[local_24];
  }
  return (int)(uint)(ushort)(local_2a - 1) >> 0xf ^ 1;
}

Assistant:

int decrypt(unsigned char *e, const unsigned char *sk, const unsigned char *c, gf *L)
{
  int i, w = 0;
  uint16_t check;

  unsigned char r[ SYS_N/8 ];

  gf g[ SYS_T+1 ];
//  gf L[ SYS_N ];

  gf s[ SYS_T*2 ];
  gf s_cmp[ SYS_T*2 ];
  gf locator[ SYS_T+1 ];
  gf images[ SYS_N ];

  gf t;

  //

  for (i = 0; i < SYND_BYTES; i++)       r[i] = c[i];
  for (i = SYND_BYTES; i < SYS_N/8; i++) r[i] = 0;

  for (i = 0; i < SYS_T; i++) { g[i] = load2(sk); g[i] &= GFMASK; sk += 2; } g[ SYS_T ] = 1;

  //support_gen(L, sk);

  synd(s, g, L, r);

  bm(locator, s);

  root(images, locator, L);

  //

  for (i = 0; i < SYS_N/8; i++)
    e[i] = 0;

  for (i = 0; i < SYS_N; i++)
  {
    t = gf_iszero(images[i]) & 1;

    e[ i/8 ] |= t << (i%8);
    w += t;

  }

#ifdef KAT
  {
    int k;
    printf("decrypt e: positions");
    for (k = 0;k < SYS_N;++k)
      if (e[k/8] & (1 << (k&7)))
        printf(" %d",k);
    printf("\n");
  }
#endif

  synd(s_cmp, g, L, e);

  //

  check = w;
  check ^= SYS_T;

  for (i = 0; i < SYS_T*2; i++)
    check |= s[i] ^ s_cmp[i];

  check -= 1;
  check >>= 15;

  return check ^ 1;
}